

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_1da1d1::Db::parseNestedName(Db *this,NameState *State)

{
  bool bVar1;
  char cVar2;
  Qualifiers QVar3;
  Node *pNVar4;
  Node *N;
  Node *CtorDtor;
  Node *S;
  Node *DT;
  Node *TA;
  Node *TP;
  undefined1 local_48 [8];
  anon_class_24_3_ca1439d7 PushComponent;
  Node *SoFar;
  undefined1 auStack_20 [4];
  Qualifiers CVTmp;
  NameState *State_local;
  Db *this_local;
  
  _auStack_20 = State;
  State_local = (NameState *)this;
  bVar1 = consumeIf(this,'N');
  if (bVar1) {
    QVar3 = parseCVQualifiers(this);
    if (_auStack_20 != (NameState *)0x0) {
      _auStack_20->CVQualifiers = QVar3;
    }
    bVar1 = consumeIf(this,'O');
    if (bVar1) {
      if (_auStack_20 != (NameState *)0x0) {
        _auStack_20->ReferenceQualifier = FrefQualRValue;
      }
    }
    else {
      bVar1 = consumeIf(this,'R');
      if (bVar1) {
        if (_auStack_20 != (NameState *)0x0) {
          _auStack_20->ReferenceQualifier = FrefQualLValue;
        }
      }
      else if (_auStack_20 != (NameState *)0x0) {
        _auStack_20->ReferenceQualifier = FrefQualNone;
      }
    }
    PushComponent.State = (NameState **)0x0;
    local_48 = (undefined1  [8])&PushComponent.State;
    PushComponent.this = (Db *)auStack_20;
    PushComponent.SoFar = (Node **)this;
    StringView::StringView((StringView *)&TP,"St");
    bVar1 = consumeIf(this,_TP);
    if (bVar1) {
      PushComponent.State =
           (NameState **)
           (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[4]>
                     ((Db *)this,(char (*) [4])"std");
    }
    do {
      while( true ) {
        bVar1 = consumeIf(this,'E');
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          if ((PushComponent.State != (NameState **)0x0) &&
             (bVar1 = PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::empty(&this->Subs),
             !bVar1)) {
            PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::pop_back(&this->Subs);
            return (Node *)PushComponent.State;
          }
          return (Node *)0x0;
        }
        consumeIf(this,'L');
        bVar1 = consumeIf(this,'M');
        if (bVar1) break;
        cVar2 = look(this,0);
        if (cVar2 == 'T') {
          TA = parseTemplateParam(this);
          if (TA == (Node *)0x0) {
            return (Node *)0x0;
          }
          parseNestedName::anon_class_24_3_ca1439d7::operator()
                    ((anon_class_24_3_ca1439d7 *)local_48,TA);
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                    (&this->Subs,(Node **)&PushComponent.State);
        }
        else {
          cVar2 = look(this,0);
          if (cVar2 == 'I') {
            DT = parseTemplateArgs(this,_auStack_20 != (NameState *)0x0);
            if ((DT == (Node *)0x0) || (PushComponent.State == (NameState **)0x0)) {
              return (Node *)0x0;
            }
            PushComponent.State =
                 (NameState **)
                 (anonymous_namespace)::Db::
                 make<(anonymous_namespace)::NameWithTemplateArgs,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
                           ((Db *)this,(Node **)&PushComponent.State,&DT);
            if (_auStack_20 != (NameState *)0x0) {
              _auStack_20->EndsWithTemplateArgs = true;
            }
            PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                      (&this->Subs,(Node **)&PushComponent.State);
          }
          else {
            cVar2 = look(this,0);
            if ((cVar2 == 'D') &&
               ((cVar2 = look(this,1), cVar2 == 't' || (cVar2 = look(this,1), cVar2 == 'T')))) {
              S = parseDecltype(this);
              if (S == (Node *)0x0) {
                return (Node *)0x0;
              }
              parseNestedName::anon_class_24_3_ca1439d7::operator()
                        ((anon_class_24_3_ca1439d7 *)local_48,S);
              PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                        (&this->Subs,(Node **)&PushComponent.State);
            }
            else {
              cVar2 = look(this,0);
              if ((cVar2 == 'S') && (cVar2 = look(this,1), cVar2 != 't')) {
                CtorDtor = parseSubstitution(this);
                if (CtorDtor == (Node *)0x0) {
                  return (Node *)0x0;
                }
                parseNestedName::anon_class_24_3_ca1439d7::operator()
                          ((anon_class_24_3_ca1439d7 *)local_48,CtorDtor);
                if ((Node *)PushComponent.State != CtorDtor) {
                  PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                            (&this->Subs,&CtorDtor);
                }
              }
              else {
                cVar2 = look(this,0);
                if ((cVar2 == 'C') ||
                   ((cVar2 = look(this,0), cVar2 == 'D' && (cVar2 = look(this,1), cVar2 != 'C')))) {
                  if (PushComponent.State == (NameState **)0x0) {
                    return (Node *)0x0;
                  }
                  pNVar4 = parseCtorDtorName(this,(Node **)&PushComponent.State,_auStack_20);
                  if (pNVar4 == (Node *)0x0) {
                    return (Node *)0x0;
                  }
                  parseNestedName::anon_class_24_3_ca1439d7::operator()
                            ((anon_class_24_3_ca1439d7 *)local_48,pNVar4);
                  PushComponent.State = (NameState **)parseAbiTags(this,(Node *)PushComponent.State)
                  ;
                  if ((Node *)PushComponent.State == (Node *)0x0) {
                    return (Node *)0x0;
                  }
                  PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                            (&this->Subs,(Node **)&PushComponent.State);
                }
                else {
                  pNVar4 = parseUnqualifiedName(this,_auStack_20);
                  if (pNVar4 == (Node *)0x0) {
                    return (Node *)0x0;
                  }
                  parseNestedName::anon_class_24_3_ca1439d7::operator()
                            ((anon_class_24_3_ca1439d7 *)local_48,pNVar4);
                  PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back
                            (&this->Subs,(Node **)&PushComponent.State);
                }
              }
            }
          }
        }
      }
    } while (PushComponent.State != (NameState **)0x0);
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseNestedName(NameState *State) {
  if (!consumeIf('N'))
    return nullptr;

  Qualifiers CVTmp = parseCVQualifiers();
  if (State) State->CVQualifiers = CVTmp;

  if (consumeIf('O')) {
    if (State) State->ReferenceQualifier = FrefQualRValue;
  } else if (consumeIf('R')) {
    if (State) State->ReferenceQualifier = FrefQualLValue;
  } else
    if (State) State->ReferenceQualifier = FrefQualNone;

  Node *SoFar = nullptr;
  auto PushComponent = [&](Node *Comp) {
    if (SoFar) SoFar = make<NestedName>(SoFar, Comp);
    else       SoFar = Comp;
    if (State) State->EndsWithTemplateArgs = false;
  };

  if (consumeIf("St"))
    SoFar = make<NameType>("std");

  while (!consumeIf('E')) {
    consumeIf('L'); // extension

    // <data-member-prefix> := <member source-name> [<template-args>] M
    if (consumeIf('M')) {
      if (SoFar == nullptr)
        return nullptr;
      continue;
    }

    //          ::= <template-param>
    if (look() == 'T') {
      Node *TP = parseTemplateParam();
      if (TP == nullptr)
        return nullptr;
      PushComponent(TP);
      Subs.push_back(SoFar);
      continue;
    }

    //          ::= <template-prefix> <template-args>
    if (look() == 'I') {
      Node *TA = parseTemplateArgs(State != nullptr);
      if (TA == nullptr || SoFar == nullptr)
        return nullptr;
      SoFar = make<NameWithTemplateArgs>(SoFar, TA);
      if (State) State->EndsWithTemplateArgs = true;
      Subs.push_back(SoFar);
      continue;
    }

    //          ::= <decltype>
    if (look() == 'D' && (look(1) == 't' || look(1) == 'T')) {
      Node *DT = parseDecltype();
      if (DT == nullptr)
        return nullptr;
      PushComponent(DT);
      Subs.push_back(SoFar);
      continue;
    }

    //          ::= <substitution>
    if (look() == 'S' && look(1) != 't') {
      Node *S = parseSubstitution();
      if (S == nullptr)
        return nullptr;
      PushComponent(S);
      if (SoFar != S)
        Subs.push_back(S);
      continue;
    }

    // Parse an <unqualified-name> thats actually a <ctor-dtor-name>.
    if (look() == 'C' || (look() == 'D' && look(1) != 'C')) {
      if (SoFar == nullptr)
        return nullptr;
      Node *CtorDtor = parseCtorDtorName(SoFar, State);
      if (CtorDtor == nullptr)
        return nullptr;
      PushComponent(CtorDtor);
      SoFar = parseAbiTags(SoFar);
      if (SoFar == nullptr)
        return nullptr;
      Subs.push_back(SoFar);
      continue;
    }

    //          ::= <prefix> <unqualified-name>
    Node *N = parseUnqualifiedName(State);
    if (N == nullptr)
      return nullptr;
    PushComponent(N);
    Subs.push_back(SoFar);
  }

  if (SoFar == nullptr || Subs.empty())
    return nullptr;

  Subs.pop_back();
  return SoFar;
}